

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  Vdbe *p_00;
  IndexedExpr *pIVar1;
  int iVar2;
  int local_3c;
  int addr;
  int iDataCur;
  Vdbe *v;
  IndexedExpr *p;
  int target_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pParse->pIdxExpr;
  do {
    if (v == (Vdbe *)0x0) {
      return -1;
    }
    local_3c = *(int *)&v->ppVPrev;
    if (-1 < local_3c) {
      if (pParse->iSelfTab != 0) {
        if (*(int *)&v->ppVPrev != pParse->iSelfTab + -1) goto LAB_002291c8;
        local_3c = -1;
      }
      iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,(Expr *)v->db,local_3c);
      if (iVar2 == 0) {
        p_00 = pParse->pVdbe;
        if (*(char *)((long)&v->pVNext + 4) != '\0') {
          iVar2 = sqlite3VdbeCurrentAddr(p_00);
          sqlite3VdbeAddOp3(p_00,0x14,*(int *)((long)&v->ppVPrev + 4),iVar2 + 3,target);
          sqlite3VdbeAddOp3(p_00,0x5e,*(int *)((long)&v->ppVPrev + 4),*(int *)&v->pVNext,target);
          sqlite3VdbeGoto(p_00,0);
          pIVar1 = pParse->pIdxExpr;
          pParse->pIdxExpr = (IndexedExpr *)0x0;
          sqlite3ExprCode(pParse,pExpr,target);
          pParse->pIdxExpr = pIVar1;
          sqlite3VdbeJumpHere(p_00,iVar2 + 2);
          return target;
        }
        sqlite3VdbeAddOp3(p_00,0x5e,*(int *)((long)&v->ppVPrev + 4),*(int *)&v->pVNext,target);
        return target;
      }
    }
LAB_002291c8:
    v = (Vdbe *)v->pParse;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxExpr; p; p=p->pIENext){
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxExpr;
      pParse->pIdxExpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxExpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}